

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCacheClear(Parse *pParse)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  
  bVar1 = pParse->nColCache;
  if (bVar1 != 0) {
    lVar4 = 0;
    do {
      if ((&pParse->aColCache[0].tempReg)[lVar4] != '\0') {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          iVar3 = *(int *)((long)&pParse->aColCache[0].iReg + lVar4);
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar3;
        }
      }
      lVar4 = lVar4 + 0x14;
    } while ((ulong)bVar1 * 0x14 != lVar4);
  }
  pParse->nColCache = '\0';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheClear(Parse *pParse){
  int i;

#ifdef SQLITE_DEBUG
  if( pParse->db->flags & SQLITE_VdbeAddopTrace ){
    printf("CLEAR\n");
  }
#endif
  for(i=0; i<pParse->nColCache; i++){
    if( pParse->aColCache[i].tempReg
     && pParse->nTempReg<ArraySize(pParse->aTempReg)
    ){
       pParse->aTempReg[pParse->nTempReg++] = pParse->aColCache[i].iReg;
    }
  }
  pParse->nColCache = 0;
}